

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse(Datetime *this,string *input,size_type *start,string *format)

{
  bool bVar1;
  size_type sVar2;
  size_type checkpoint;
  undefined1 local_58 [8];
  Pig pig;
  size_type i;
  string *format_local;
  size_type *start_local;
  string *input_local;
  Datetime *this_local;
  
  pig._saved = *start;
  Pig::Pig((Pig *)local_58,input);
  if (pig._saved != 0) {
    Pig::skipN((Pig *)local_58,(int)pig._saved);
  }
  sVar2 = Pig::cursor((Pig *)local_58);
  bVar1 = parse_epoch(this,(Pig *)local_58);
  if (bVar1) {
    sVar2 = Pig::cursor((Pig *)local_58);
    *start = sVar2;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = parse_formatted(this,(Pig *)local_58,format);
    if ((bVar1) && (bVar1 = validate(this), bVar1)) {
      sVar2 = Pig::cursor((Pig *)local_58);
      *start = sVar2;
      resolve(this);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = parse_date_time_ext(this,(Pig *)local_58);
      if ((((bVar1) || (bVar1 = parse_date_time(this,(Pig *)local_58), bVar1)) ||
          (((isoEnabled & 1U) != 0 &&
           (((bVar1 = parse_date_ext(this,(Pig *)local_58), bVar1 ||
             (((((standaloneDateEnabled & 1U) != 0 &&
                (bVar1 = parse_date(this,(Pig *)local_58), bVar1)) ||
               (bVar1 = parse_time_utc_ext(this,(Pig *)local_58), bVar1)) ||
              ((bVar1 = parse_time_utc(this,(Pig *)local_58), bVar1 ||
               (bVar1 = parse_time_off_ext(this,(Pig *)local_58), bVar1)))))) ||
            ((bVar1 = parse_time_ext(this,(Pig *)local_58,true), bVar1 ||
             ((((standaloneTimeEnabled & 1U) != 0 &&
               (bVar1 = parse_time(this,(Pig *)local_58,true), bVar1)) ||
              (((standaloneTimeEnabled & 1U) != 0 &&
               (bVar1 = parse_time_off(this,(Pig *)local_58), bVar1)))))))))))) &&
         (bVar1 = validate(this), bVar1)) {
        sVar2 = Pig::cursor((Pig *)local_58);
        *start = sVar2;
        resolve(this);
        this_local._7_1_ = true;
      }
      else {
        Pig::restoreTo((Pig *)local_58,sVar2);
        bVar1 = parse_named(this,(Pig *)local_58);
        if (bVar1) {
          sVar2 = Pig::cursor((Pig *)local_58);
          *start = sVar2;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  Pig::~Pig((Pig *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Datetime::parse (
  const std::string& input,
  std::string::size_type& start,
  const std::string& format)
{
  auto i = start;
  Pig pig (input);
  if (i)
    pig.skipN (static_cast <int> (i));

  auto checkpoint = pig.cursor ();

  // Parse epoch first, as it's the most common scenario.
  if (parse_epoch (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  if (parse_formatted (pig, format))
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  // Allow parse_date_time and parse_date_time_ext regardless of
  // Datetime::isoEnabled setting, because these formats are relied upon by
  // the 'import' command, JSON parser and hook system.
  if (parse_date_time_ext   (pig) || // Strictest first.
      parse_date_time       (pig) ||
      (Datetime::isoEnabled &&
       (                                    parse_date_ext      (pig)  ||
        (Datetime::standaloneDateEnabled && parse_date          (pig)) ||
                                            parse_time_utc_ext  (pig)  ||
                                            parse_time_utc      (pig)  ||
                                            parse_time_off_ext  (pig)  ||
                                            parse_time_ext      (pig)  ||
        (Datetime::standaloneTimeEnabled && parse_time          (pig)) || // Time last, as it is the most permissive.
        (Datetime::standaloneTimeEnabled && parse_time_off      (pig))
       )
      )
     )
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  pig.restoreTo (checkpoint);

  if (parse_named (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  return false;
}